

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec,xmlChar *value,void *data,int compound)

{
  xmlRegAtomPtr pxVar1;
  xmlRegStatePtr pxVar2;
  xmlRegStatePtr pxVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  xmlRegTrans *pxVar8;
  xmlRegTrans *pxVar9;
  xmlRegCounter *pxVar10;
  bool bVar11;
  bool local_bc;
  xmlRegStatePtr state;
  int transno;
  xmlRegStatePtr to;
  int count_3;
  xmlRegCounterPtr counter_3;
  xmlRegCounterPtr counter_2;
  int count_2;
  xmlRegCounterPtr counter_1;
  xmlRegTransPtr t_1;
  int count_1;
  int i_1;
  xmlRegCounterPtr counter;
  xmlRegTransPtr t;
  int local_50;
  int count;
  int i;
  int progress;
  int final;
  int ret;
  xmlRegAtomPtr atom;
  xmlRegTransPtr trans;
  void *pvStack_28;
  int compound_local;
  void *data_local;
  xmlChar *value_local;
  xmlRegExecCtxtPtr exec_local;
  
  bVar4 = false;
  bVar5 = true;
  if (exec == (xmlRegExecCtxtPtr)0x0) {
    exec_local._4_4_ = 0xffffffff;
  }
  else if (exec->comp == (xmlRegexpPtr)0x0) {
    exec_local._4_4_ = 0xffffffff;
  }
  else if (exec->status == 0) {
    if (exec->comp->compact == (int *)0x0) {
      if (value == (xmlChar *)0x0) {
        if (exec->state->type == XML_REGEXP_FINAL_STATE) {
          return 1;
        }
        bVar4 = true;
      }
      pvStack_28 = data;
      data_local = value;
      if ((value != (xmlChar *)0x0) && (0 < exec->inputStackNr)) {
        xmlFARegExecSaveInputString(exec,value,data);
        data_local = exec->inputStack[exec->index].value;
        pvStack_28 = exec->inputStack[exec->index].data;
      }
LAB_001b2fd1:
      bVar11 = false;
      if (((exec->status == 0) && (bVar11 = true, data_local == (void *)0x0)) &&
         (bVar11 = false, bVar4)) {
        bVar11 = exec->state->type != XML_REGEXP_FINAL_STATE;
      }
      if (bVar11) {
        if ((data_local != (void *)0x0) || (exec->counts != (int *)0x0)) goto LAB_001b3051;
        goto LAB_001b387a;
      }
LAB_001b3976:
      if (exec->status == 0) {
        exec_local._4_4_ = (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
      }
      else {
        exec_local._4_4_ = exec->status;
      }
    }
    else {
      exec_local._4_4_ = xmlRegCompactPushString(exec,exec->comp,value,data);
    }
  }
  else {
    exec_local._4_4_ = exec->status;
  }
  return exec_local._4_4_;
LAB_001b3051:
  exec->transcount = 0;
  while (exec->transno < exec->state->nbTrans) {
    pxVar8 = exec->state->trans + exec->transno;
    if (-1 < pxVar8->to) {
      pxVar1 = pxVar8->atom;
      progress = 0;
      if (pxVar8->count == 0x123457) {
        progress = 0;
        if ((data_local == (void *)0x0) && (bVar4)) {
          progress = 1;
        }
        else if (data_local != (void *)0x0) {
          for (local_50 = 0; local_50 < exec->state->nbTrans; local_50 = local_50 + 1) {
            pxVar9 = exec->state->trans + local_50;
            if ((-1 < pxVar9->counter) && (pxVar9 != pxVar8)) {
              pxVar10 = exec->comp->counters + pxVar9->counter;
              iVar7 = exec->counts[pxVar9->counter];
              if ((iVar7 < pxVar10->max) &&
                 ((pxVar9->atom != (xmlRegAtomPtr)0x0 &&
                  (iVar6 = xmlStrEqual((xmlChar *)data_local,(xmlChar *)pxVar9->atom->valuep),
                  iVar6 != 0)))) {
                progress = 0;
                break;
              }
              if ((((pxVar10->min <= iVar7) && (iVar7 < pxVar10->max)) &&
                  (pxVar9->atom != (xmlRegAtomPtr)0x0)) &&
                 (iVar7 = xmlStrEqual((xmlChar *)data_local,(xmlChar *)pxVar9->atom->valuep),
                 iVar7 != 0)) {
                progress = 1;
                break;
              }
            }
          }
        }
      }
      else if (pxVar8->count == 0x123456) {
        progress = 1;
        for (t_1._4_4_ = 0; t_1._4_4_ < exec->state->nbTrans; t_1._4_4_ = t_1._4_4_ + 1) {
          pxVar9 = exec->state->trans + t_1._4_4_;
          if ((-1 < pxVar9->counter) && (pxVar9 != pxVar8)) {
            pxVar10 = exec->comp->counters + pxVar9->counter;
            if ((exec->counts[pxVar9->counter] < pxVar10->min) ||
               (pxVar10->max < exec->counts[pxVar9->counter])) {
              progress = 0;
              break;
            }
          }
        }
      }
      else if (pxVar8->count < 0) {
        if (pxVar1 == (xmlRegAtomPtr)0x0) {
          exec->status = -4;
          break;
        }
        if (data_local != (void *)0x0) {
          progress = xmlRegStrEqualWildcard((xmlChar *)pxVar1->valuep,(xmlChar *)data_local);
          if ((pxVar1->neg != 0) && (progress = (int)((progress != 0 ^ 0xffU) & 1), compound == 0))
          {
            progress = 0;
          }
          if (((progress == 1) && (-1 < pxVar8->counter)) &&
             (exec->comp->counters[pxVar8->counter].max <= exec->counts[pxVar8->counter])) {
            progress = 0;
          }
          if (((progress == 1) && (0 < pxVar1->min)) && (0 < pxVar1->max)) {
            pxVar2 = exec->comp->states[pxVar8->to];
            if (exec->transno + 1 < exec->state->nbTrans) {
              if (exec->inputStackNr < 1) {
                xmlFARegExecSaveInputString(exec,(xmlChar *)data_local,pvStack_28);
              }
              xmlFARegExecSave(exec);
            }
            exec->transcount = 1;
            do {
              if (exec->transcount == pxVar1->max) break;
              exec->index = exec->index + 1;
              data_local = exec->inputStack[exec->index].value;
              pvStack_28 = exec->inputStack[exec->index].data;
              if ((xmlChar *)data_local == (xmlChar *)0x0) {
                exec->index = exec->index + -1;
                break;
              }
              if (pxVar1->min <= exec->transcount) {
                iVar7 = exec->transno;
                pxVar3 = exec->state;
                exec->transno = -1;
                exec->state = pxVar2;
                if (exec->inputStackNr < 1) {
                  xmlFARegExecSaveInputString(exec,(xmlChar *)data_local,pvStack_28);
                }
                xmlFARegExecSave(exec);
                exec->transno = iVar7;
                exec->state = pxVar3;
              }
              progress = xmlStrEqual((xmlChar *)data_local,(xmlChar *)pxVar1->valuep);
              exec->transcount = exec->transcount + 1;
            } while (progress == 1);
            if (exec->transcount < pxVar1->min) {
              progress = 0;
            }
            if (progress < 0) {
              progress = 0;
            }
            if (progress == 0) goto LAB_001b387a;
          }
        }
      }
      else {
        pxVar10 = exec->comp->counters + pxVar8->count;
        local_bc = false;
        if (pxVar10->min <= exec->counts[pxVar8->count]) {
          local_bc = exec->counts[pxVar8->count] <= pxVar10->max;
        }
        progress = (int)local_bc;
      }
      if (progress == 1) {
        if (((exec->callback != (xmlRegExecCallbacks)0x0) && (pxVar1 != (xmlRegAtomPtr)0x0)) &&
           (pvStack_28 != (void *)0x0)) {
          (*exec->callback)((xmlRegExecCtxtPtr)exec->data,(xmlChar *)pxVar1->valuep,pxVar1->data,
                            pvStack_28);
        }
        if (exec->transno + 1 < exec->state->nbTrans) {
          if (exec->inputStackNr < 1) {
            xmlFARegExecSaveInputString(exec,(xmlChar *)data_local,pvStack_28);
          }
          xmlFARegExecSave(exec);
        }
        if (-1 < pxVar8->counter) {
          exec->counts[pxVar8->counter] = exec->counts[pxVar8->counter] + 1;
        }
        if ((-1 < pxVar8->count) && (pxVar8->count < 0x123456)) {
          exec->counts[pxVar8->count] = 0;
        }
        if ((exec->comp->states[pxVar8->to] != (xmlRegStatePtr)0x0) &&
           (exec->comp->states[pxVar8->to]->type == XML_REGEXP_SINK_STATE)) {
          iVar7 = xmlRegExecSetErrString(exec,(xmlChar *)data_local);
          if (iVar7 < 0) break;
          exec->errState = exec->state;
          memcpy(exec->errCounts,exec->counts,(long)exec->comp->nbCounters << 2);
        }
        exec->state = exec->comp->states[pxVar8->to];
        exec->transno = 0;
        if (pxVar8->atom != (xmlRegAtomPtr)0x0) {
          if (exec->inputStack == (xmlRegInputTokenPtr)0x0) {
            data_local = (void *)0x0;
            pvStack_28 = (void *)0x0;
          }
          else {
            exec->index = exec->index + 1;
            if (exec->index < exec->inputStackNr) {
              data_local = exec->inputStack[exec->index].value;
              pvStack_28 = exec->inputStack[exec->index].data;
            }
            else {
              data_local = (void *)0x0;
              pvStack_28 = (void *)0x0;
            }
          }
        }
        bVar5 = true;
        goto LAB_001b2fd1;
      }
      if (progress < 0) {
        exec->status = -4;
        break;
      }
    }
    exec->transno = exec->transno + 1;
  }
  if ((exec->transno != 0) || (exec->state->nbTrans == 0)) {
LAB_001b387a:
    if ((bVar5) &&
       ((exec->state != (xmlRegStatePtr)0x0 && (exec->state->type != XML_REGEXP_SINK_STATE)))) {
      bVar5 = false;
      iVar7 = xmlRegExecSetErrString(exec,(xmlChar *)data_local);
      if (iVar7 < 0) goto LAB_001b3976;
      exec->errState = exec->state;
      if (exec->comp->nbCounters != 0) {
        memcpy(exec->errCounts,exec->counts,(long)exec->comp->nbCounters << 2);
      }
    }
    exec->determinist = 0;
    xmlFARegExecRollBack(exec);
    if ((exec->inputStack != (xmlRegInputTokenPtr)0x0) && (exec->status == 0)) {
      data_local = exec->inputStack[exec->index].value;
      pvStack_28 = exec->inputStack[exec->index].data;
    }
  }
  goto LAB_001b2fd1;
}

Assistant:

static int
xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                     void *data, int compound) {
    xmlRegTransPtr trans;
    xmlRegAtomPtr atom;
    int ret;
    int final = 0;
    int progress = 1;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != XML_REGEXP_OK)
	return(exec->status);

    if (exec->comp->compact != NULL)
	return(xmlRegCompactPushString(exec, exec->comp, value, data));

    if (value == NULL) {
        if (exec->state->type == XML_REGEXP_FINAL_STATE)
	    return(1);
	final = 1;
    }

    /*
     * If we have an active rollback stack push the new value there
     * and get back to where we were left
     */
    if ((value != NULL) && (exec->inputStackNr > 0)) {
	xmlFARegExecSaveInputString(exec, value, data);
	value = exec->inputStack[exec->index].value;
	data = exec->inputStack[exec->index].data;
    }

    while ((exec->status == XML_REGEXP_OK) &&
	   ((value != NULL) ||
	    ((final == 1) &&
	     (exec->state->type != XML_REGEXP_FINAL_STATE)))) {

	/*
	 * End of input on non-terminal state, rollback, however we may
	 * still have epsilon like transition for counted transitions
	 * on counters, in that case don't break too early.
	 */
	if ((value == NULL) && (exec->counts == NULL))
	    goto rollback;

	exec->transcount = 0;
	for (;exec->transno < exec->state->nbTrans;exec->transno++) {
	    trans = &exec->state->trans[exec->transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    ret = 0;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 0;

		/*
		 * Check all counted transitions from the current state
		 */
		if ((value == NULL) && (final)) {
		    ret = 1;
		} else if (value != NULL) {
		    for (i = 0;i < exec->state->nbTrans;i++) {
			t = &exec->state->trans[i];
			if ((t->counter < 0) || (t == trans))
			    continue;
			counter = &exec->comp->counters[t->counter];
			count = exec->counts[t->counter];
			if ((count < counter->max) &&
		            (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 0;
			    break;
			}
			if ((count >= counter->min) &&
			    (count < counter->max) &&
			    (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 1;
			    break;
			}
		    }
		}
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 1;

		/*
		 * Check all counted transitions from the current state
		 */
		for (i = 0;i < exec->state->nbTrans;i++) {
                    t = &exec->state->trans[i];
		    if ((t->counter < 0) || (t == trans))
			continue;
                    counter = &exec->comp->counters[t->counter];
		    count = exec->counts[t->counter];
		    if ((count < counter->min) || (count > counter->max)) {
			ret = 0;
			break;
		    }
		}
	    } else if (trans->count >= 0) {
		int count;
		xmlRegCounterPtr counter;

		/*
		 * A counted transition.
		 */

		count = exec->counts[trans->count];
		counter = &exec->comp->counters[trans->count];
		ret = ((count >= counter->min) && (count <= counter->max));
	    } else if (atom == NULL) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    } else if (value != NULL) {
		ret = xmlRegStrEqualWildcard(atom->valuep, value);
		if (atom->neg) {
		    ret = !ret;
		    if (!compound)
		        ret = 0;
		}
		if ((ret == 1) && (trans->counter >= 0)) {
		    xmlRegCounterPtr counter;
		    int count;

		    count = exec->counts[trans->counter];
		    counter = &exec->comp->counters[trans->counter];
		    if (count >= counter->max)
			ret = 0;
		}

		if ((ret == 1) && (atom->min > 0) && (atom->max > 0)) {
		    xmlRegStatePtr to = exec->comp->states[trans->to];

		    /*
		     * this is a multiple input sequence
		     */
		    if (exec->state->nbTrans > exec->transno + 1) {
			if (exec->inputStackNr <= 0) {
			    xmlFARegExecSaveInputString(exec, value, data);
			}
			xmlFARegExecSave(exec);
		    }
		    exec->transcount = 1;
		    do {
			/*
			 * Try to progress as much as possible on the input
			 */
			if (exec->transcount == atom->max) {
			    break;
			}
			exec->index++;
			value = exec->inputStack[exec->index].value;
			data = exec->inputStack[exec->index].data;

			/*
			 * End of input: stop here
			 */
			if (value == NULL) {
			    exec->index --;
			    break;
			}
			if (exec->transcount >= atom->min) {
			    int transno = exec->transno;
			    xmlRegStatePtr state = exec->state;

			    /*
			     * The transition is acceptable save it
			     */
			    exec->transno = -1; /* trick */
			    exec->state = to;
			    if (exec->inputStackNr <= 0) {
				xmlFARegExecSaveInputString(exec, value, data);
			    }
			    xmlFARegExecSave(exec);
			    exec->transno = transno;
			    exec->state = state;
			}
			ret = xmlStrEqual(value, atom->valuep);
			exec->transcount++;
		    } while (ret == 1);
		    if (exec->transcount < atom->min)
			ret = 0;

		    /*
		     * If the last check failed but one transition was found
		     * possible, rollback
		     */
		    if (ret < 0)
			ret = 0;
		    if (ret == 0) {
			goto rollback;
		    }
		}
	    }
	    if (ret == 1) {
		if ((exec->callback != NULL) && (atom != NULL) &&
			(data != NULL)) {
		    exec->callback(exec->data, atom->valuep,
			           atom->data, data);
		}
		if (exec->state->nbTrans > exec->transno + 1) {
		    if (exec->inputStackNr <= 0) {
			xmlFARegExecSaveInputString(exec, value, data);
		    }
		    xmlFARegExecSave(exec);
		}
		if (trans->counter >= 0) {
		    exec->counts[trans->counter]++;
		}
		if ((trans->count >= 0) &&
		    (trans->count < REGEXP_ALL_COUNTER)) {
		    exec->counts[trans->count] = 0;
		}
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    /*
		     * entering a sink state, save the current state as error
		     * state.
		     */
                    if (xmlRegExecSetErrString(exec, value) < 0)
                        break;
		    exec->errState = exec->state;
		    memcpy(exec->errCounts, exec->counts,
			   exec->comp->nbCounters * sizeof(int));
		}
		exec->state = exec->comp->states[trans->to];
		exec->transno = 0;
		if (trans->atom != NULL) {
		    if (exec->inputStack != NULL) {
			exec->index++;
			if (exec->index < exec->inputStackNr) {
			    value = exec->inputStack[exec->index].value;
			    data = exec->inputStack[exec->index].data;
			} else {
			    value = NULL;
			    data = NULL;
			}
		    } else {
			value = NULL;
			data = NULL;
		    }
		}
		goto progress;
	    } else if (ret < 0) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    }
	}
	if ((exec->transno != 0) || (exec->state->nbTrans == 0)) {
rollback:
            /*
	     * if we didn't yet rollback on the current input
	     * store the current state as the error state.
	     */
	    if ((progress) && (exec->state != NULL) &&
	        (exec->state->type != XML_REGEXP_SINK_STATE)) {
	        progress = 0;
                if (xmlRegExecSetErrString(exec, value) < 0)
                    break;
		exec->errState = exec->state;
                if (exec->comp->nbCounters)
                    memcpy(exec->errCounts, exec->counts,
                           exec->comp->nbCounters * sizeof(int));
	    }

	    /*
	     * Failed to find a way out
	     */
	    exec->determinist = 0;
	    xmlFARegExecRollBack(exec);
	    if ((exec->inputStack != NULL ) &&
                (exec->status == XML_REGEXP_OK)) {
		value = exec->inputStack[exec->index].value;
		data = exec->inputStack[exec->index].data;
	    }
	}
	continue;
progress:
        progress = 1;
    }
    if (exec->status == XML_REGEXP_OK) {
        return(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
    return(exec->status);
}